

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O0

char * gears_engine_name(int opt)

{
  list *local_28;
  list *engine_entry;
  engine_t *engine;
  int nb;
  int opt_local;
  
  engine._0_4_ = 0;
  local_28 = engine_list.next;
  while( true ) {
    if (local_28 == &engine_list) {
      return (char *)0x0;
    }
    if ((int)engine == opt) break;
    engine._0_4_ = (int)engine + 1;
    local_28 = local_28->next;
  }
  return (char *)local_28[-3].prev;
}

Assistant:

char *gears_engine_name(int opt)
{
  int nb = 0;
  engine_t *engine = NULL;
  struct list *engine_entry = NULL;

  LIST_FOR_EACH(engine_entry, &engine_list) {
    engine = LIST_ENTRY(engine_entry, engine_t, entry);
    if (nb == opt) {
      return engine->name;
    }
    nb++;
  }

  return NULL;
}